

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O1

_Bool setup_pixel_format(SWindowData_X11 *window_data_x11)

{
  GLXContext p_Var1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  GLint glxAttribs [21];
  undefined8 auStack_68 [10];
  undefined4 local_18;
  
  puVar3 = &DAT_00105600;
  puVar4 = auStack_68;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  local_18 = 0;
  lVar2 = glXChooseVisual(window_data_x11->display,window_data_x11->screen);
  if (lVar2 == 0) {
    setup_pixel_format_cold_1();
  }
  else {
    p_Var1 = (GLXContext)glXCreateContext(window_data_x11->display,lVar2,0,1);
    window_data_x11->context = p_Var1;
  }
  return lVar2 != 0;
}

Assistant:

bool
setup_pixel_format(SWindowData_X11 *window_data_x11) {
    GLint glxAttribs[] = {
        GLX_RGBA,
        GLX_DOUBLEBUFFER,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_RED_SIZE,       8,
        GLX_GREEN_SIZE,     8,
        GLX_BLUE_SIZE,      8,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_SAMPLE_BUFFERS, 0,
        GLX_SAMPLES,        0,
        None
    };

    XVisualInfo* visualInfo = glXChooseVisual(window_data_x11->display, window_data_x11->screen, glxAttribs);
    if (visualInfo == 0) {
        fprintf(stderr, "Could not create correct visual window.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    window_data_x11->context = glXCreateContext(window_data_x11->display, visualInfo, NULL, GL_TRUE);

    return true;
}